

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O3

void __thiscall duckdb::ParquetExtension::Load(ParquetExtension *this,DuckDB *db)

{
  pointer *ppRVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  vector<duckdb::TableFunction,_true> *pvVar3;
  size_type *psVar4;
  iterator __position;
  type pDVar5;
  FileSystem *pFVar6;
  reference pvVar7;
  DBConfig *this_00;
  long lVar8;
  initializer_list<duckdb::LogicalType> __l;
  __alloc_node_gen_t __alloc_node_gen_5;
  TableFunctionSet scan_fun;
  PragmaFunction parquet_key_fun;
  CopyFunction function;
  ParquetBloomProbeFunction bloom_probe_fun;
  ParquetFileMetadataFunction file_meta_fun;
  ParquetKeyValueMetadataFunction kv_meta_fun;
  ParquetSchemaFunction schema_fun;
  ParquetMetaDataFunction meta_fun;
  string local_1c90;
  allocator_type local_1c69;
  long *local_1c68;
  undefined1 local_1c60 [64];
  __hashtable_alloc *local_1c20;
  DuckDB *local_1c18;
  undefined1 *local_1c10;
  char *local_1c08;
  undefined1 local_1c00 [16];
  vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_> local_1bf0;
  LogicalType local_1bd8;
  LogicalType local_1bc0;
  LogicalType local_1ba8;
  LogicalType local_1b90;
  LogicalType local_1b78;
  LogicalType local_1b60;
  LogicalType local_1b48;
  vector<duckdb::LogicalType,_true> local_1b30;
  string local_1b18;
  string local_1af8;
  string local_1ad8;
  string local_1ab8;
  string local_1a98;
  TableFunctionSet local_1a78;
  TableFunctionSet local_1a40;
  TableFunctionSet local_1a08;
  TableFunctionSet local_19d0;
  TableFunctionSet local_1998;
  TableFunctionSet local_1960;
  TableFunctionSet local_1928;
  undefined1 local_18f0 [144];
  __buckets_ptr local_1860;
  size_type local_1858;
  __node_base local_1850;
  size_type local_1848;
  _Prime_rehash_policy local_1840;
  __node_base_ptr local_1830;
  PragmaType local_1828;
  undefined7 uStack_1827;
  pragma_query_t p_Stack_1820;
  pragma_function_t local_1818;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1810;
  PragmaFunction local_17d8;
  undefined1 local_16c0 [256];
  string local_15c0 [32];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_15a0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1588 [24];
  LogicalTypeId local_1570;
  PhysicalType local_156f;
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_1568;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  local_1558 [56];
  undefined1 auStack_1520 [216];
  shared_ptr<duckdb::TableFunctionInfo,_true> local_1448;
  TableFunctionInitialization local_1438;
  _Alloc_hider local_1430;
  char *local_1428;
  char local_1420 [16];
  undefined1 local_1410 [144];
  __buckets_ptr local_1380;
  size_type local_1378;
  __node_base local_1370;
  size_type local_1368;
  _Prime_rehash_policy local_1360;
  __node_base_ptr local_1350;
  undefined1 auStack_1348 [216];
  element_type *local_1270;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1268;
  TableFunctionInitialization local_1260;
  undefined1 local_1258 [144];
  __buckets_ptr local_11c8;
  size_type local_11c0;
  __node_base local_11b8;
  size_type local_11b0;
  _Prime_rehash_policy local_11a8;
  __node_base_ptr local_1198;
  undefined1 auStack_1190 [216];
  element_type *local_10b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10b0;
  TableFunctionInitialization local_10a8;
  undefined1 local_10a0 [144];
  __buckets_ptr local_1010;
  size_type local_1008;
  __node_base local_1000;
  size_type local_ff8;
  _Prime_rehash_policy local_ff0;
  __node_base_ptr local_fe0;
  undefined1 auStack_fd8 [216];
  element_type *local_f00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ef8;
  TableFunctionInitialization local_ef0;
  undefined1 local_ee8 [144];
  __buckets_ptr local_e58;
  size_type local_e50;
  __node_base local_e48;
  size_type local_e40;
  _Prime_rehash_policy local_e38;
  __node_base_ptr local_e28;
  undefined1 auStack_e20 [216];
  element_type *local_d48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d40;
  TableFunctionInitialization local_d38;
  undefined1 local_d30 [144];
  __buckets_ptr local_ca0;
  size_type local_c98;
  __node_base local_c90;
  size_type local_c88;
  _Prime_rehash_policy local_c80;
  __node_base_ptr local_c70;
  undefined1 auStack_c68 [216];
  element_type *local_b90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b88;
  TableFunctionInitialization local_b80;
  ParquetBloomProbeFunction local_b78;
  ParquetFileMetadataFunction local_9c0;
  ParquetKeyValueMetadataFunction local_808;
  ParquetSchemaFunction local_650;
  ParquetMetaDataFunction local_498;
  CopyFunction local_2e0;
  
  pDVar5 = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&db->instance);
  pFVar6 = DuckDB::GetFileSystem(db);
  local_1c68 = (long *)operator_new(8);
  *local_1c68 = (long)&PTR__FileSystem_0247c688;
  (*pFVar6->_vptr_FileSystem[0x1b])(pFVar6);
  if (local_1c68 != (long *)0x0) {
    (**(code **)(*local_1c68 + 8))();
  }
  local_1c68 = (long *)0x0;
  local_1c18 = db;
  ParquetScanFunction::GetFunctionSet();
  ::std::__cxx11::string::_M_replace((ulong)&local_1c10,0,local_1c08,0x1d8c93d);
  paVar2 = &local_1a40.super_FunctionSet<duckdb::TableFunction>.name.field_2;
  local_1a40.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a40,local_1c10,local_1c08 + (long)local_1c10);
  pvVar3 = &local_1a40.super_FunctionSet<duckdb::TableFunction>.functions;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::vector
            (&pvVar3->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_1bf0);
  ExtensionUtil::RegisterFunction(pDVar5,&local_1a40);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&pvVar3->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a40.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a40.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  ::std::__cxx11::string::_M_replace((ulong)&local_1c10,0,local_1c08,0x1e053d1);
  paVar2 = &local_1a78.super_FunctionSet<duckdb::TableFunction>.name.field_2;
  local_1a78.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a78,local_1c10,local_1c08 + (long)local_1c10);
  pvVar3 = &local_1a78.super_FunctionSet<duckdb::TableFunction>.functions;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::vector
            (&pvVar3->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_1bf0);
  ExtensionUtil::RegisterFunction(pDVar5,&local_1a78);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&pvVar3->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a78.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a78.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  ParquetMetaDataFunction::ParquetMetaDataFunction(&local_498);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_d30,(SimpleFunction *)&local_498);
  local_d30._0_8_ = &PTR__SimpleNamedParameterFunction_0243ff38;
  local_16c0._0_8_ = &local_ca0;
  local_ca0 = (__buckets_ptr)0x0;
  local_c98 = local_498.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h
              ._M_bucket_count;
  local_c90._M_nxt = (_Hash_node_base *)0x0;
  local_c88 = local_498.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h
              ._M_element_count;
  local_c80._M_max_load_factor =
       local_498.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_rehash_policy._M_max_load_factor;
  local_c80._4_4_ =
       local_498.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_rehash_policy._4_4_;
  local_c80._M_next_resize =
       local_498.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_rehash_policy._M_next_resize;
  local_c70 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_16c0._0_8_,
             &local_498.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h
             ,(_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
               *)local_16c0);
  local_d30._0_8_ = &PTR__TableFunction_02435168;
  switchD_012b9b0d::default(auStack_c68,&local_498.super_TableFunction.bind,0xd6);
  local_b90 = local_498.super_TableFunction.function_info.internal.
              super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b88._M_pi =
       local_498.super_TableFunction.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_498.super_TableFunction.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_498.super_TableFunction.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_498.super_TableFunction.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_498.super_TableFunction.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_498.super_TableFunction.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_b80 = local_498.super_TableFunction.global_initialization;
  MultiFileReader::CreateFunctionSet(&local_1928,(TableFunction *)local_d30);
  ExtensionUtil::RegisterFunction(pDVar5,&local_1928);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&local_1928.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1928.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p !=
      &local_1928.super_FunctionSet<duckdb::TableFunction>.name.field_2) {
    operator_delete(local_1928.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  local_d30._0_8_ = &PTR__TableFunction_02435168;
  if (local_b88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b88._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_d30);
  ParquetSchemaFunction::ParquetSchemaFunction(&local_650);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_ee8,(SimpleFunction *)&local_650);
  local_ee8._0_8_ = &PTR__SimpleNamedParameterFunction_0243ff38;
  local_16c0._0_8_ = &local_e58;
  local_e58 = (__buckets_ptr)0x0;
  local_e50 = local_650.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h
              ._M_bucket_count;
  local_e48._M_nxt = (_Hash_node_base *)0x0;
  local_e40 = local_650.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h
              ._M_element_count;
  local_e38._M_max_load_factor =
       local_650.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_rehash_policy._M_max_load_factor;
  local_e38._4_4_ =
       local_650.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_rehash_policy._4_4_;
  local_e38._M_next_resize =
       local_650.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_rehash_policy._M_next_resize;
  local_e28 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_16c0._0_8_,
             &local_650.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h
             ,(_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
               *)local_16c0);
  local_ee8._0_8_ = &PTR__TableFunction_02435168;
  switchD_012b9b0d::default(auStack_e20,&local_650.super_TableFunction.bind,0xd6);
  local_d48 = local_650.super_TableFunction.function_info.internal.
              super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_d40._M_pi =
       local_650.super_TableFunction.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_650.super_TableFunction.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_650.super_TableFunction.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_650.super_TableFunction.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_650.super_TableFunction.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_650.super_TableFunction.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_d38 = local_650.super_TableFunction.global_initialization;
  MultiFileReader::CreateFunctionSet(&local_1960,(TableFunction *)local_ee8);
  ExtensionUtil::RegisterFunction(pDVar5,&local_1960);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&local_1960.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1960.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p !=
      &local_1960.super_FunctionSet<duckdb::TableFunction>.name.field_2) {
    operator_delete(local_1960.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  local_ee8._0_8_ = &PTR__TableFunction_02435168;
  if (local_d40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d40._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_ee8);
  ParquetKeyValueMetadataFunction::ParquetKeyValueMetadataFunction(&local_808);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_10a0,(SimpleFunction *)&local_808);
  local_10a0._0_8_ = &PTR__SimpleNamedParameterFunction_0243ff38;
  local_16c0._0_8_ = &local_1010;
  local_1010 = (__buckets_ptr)0x0;
  local_1008 = local_808.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters.
               _M_h._M_bucket_count;
  local_1000._M_nxt = (_Hash_node_base *)0x0;
  local_ff8 = local_808.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h
              ._M_element_count;
  local_ff0._M_max_load_factor =
       local_808.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_rehash_policy._M_max_load_factor;
  local_ff0._4_4_ =
       local_808.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_rehash_policy._4_4_;
  local_ff0._M_next_resize =
       local_808.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_rehash_policy._M_next_resize;
  local_fe0 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_16c0._0_8_,
             &local_808.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h
             ,(_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
               *)local_16c0);
  local_10a0._0_8_ = &PTR__TableFunction_02435168;
  switchD_012b9b0d::default(auStack_fd8,&local_808.super_TableFunction.bind,0xd6);
  local_f00 = local_808.super_TableFunction.function_info.internal.
              super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_ef8._M_pi =
       local_808.super_TableFunction.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_808.super_TableFunction.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_808.super_TableFunction.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_808.super_TableFunction.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_808.super_TableFunction.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_808.super_TableFunction.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_ef0 = local_808.super_TableFunction.global_initialization;
  MultiFileReader::CreateFunctionSet(&local_1998,(TableFunction *)local_10a0);
  ExtensionUtil::RegisterFunction(pDVar5,&local_1998);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&local_1998.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1998.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p !=
      &local_1998.super_FunctionSet<duckdb::TableFunction>.name.field_2) {
    operator_delete(local_1998.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  local_10a0._0_8_ = &PTR__TableFunction_02435168;
  if (local_ef8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ef8._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_10a0);
  ParquetFileMetadataFunction::ParquetFileMetadataFunction(&local_9c0);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_1258,(SimpleFunction *)&local_9c0);
  local_1258._0_8_ = &PTR__SimpleNamedParameterFunction_0243ff38;
  local_16c0._0_8_ = &local_11c8;
  local_11c8 = (__buckets_ptr)0x0;
  local_11c0 = local_9c0.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters.
               _M_h._M_bucket_count;
  local_11b8._M_nxt = (_Hash_node_base *)0x0;
  local_11b0 = local_9c0.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters.
               _M_h._M_element_count;
  local_11a8._M_max_load_factor =
       local_9c0.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_rehash_policy._M_max_load_factor;
  local_11a8._4_4_ =
       local_9c0.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_rehash_policy._4_4_;
  local_11a8._M_next_resize =
       local_9c0.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_rehash_policy._M_next_resize;
  local_1198 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_16c0._0_8_,
             &local_9c0.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h
             ,(_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
               *)local_16c0);
  local_1258._0_8_ = &PTR__TableFunction_02435168;
  switchD_012b9b0d::default(auStack_1190,&local_9c0.super_TableFunction.bind,0xd6);
  local_10b8 = local_9c0.super_TableFunction.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_10b0._M_pi =
       local_9c0.super_TableFunction.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_9c0.super_TableFunction.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_9c0.super_TableFunction.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_9c0.super_TableFunction.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_9c0.super_TableFunction.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_9c0.super_TableFunction.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_10a8 = local_9c0.super_TableFunction.global_initialization;
  MultiFileReader::CreateFunctionSet(&local_19d0,(TableFunction *)local_1258);
  ExtensionUtil::RegisterFunction(pDVar5,&local_19d0);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&local_19d0.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19d0.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p !=
      &local_19d0.super_FunctionSet<duckdb::TableFunction>.name.field_2) {
    operator_delete(local_19d0.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  local_1258._0_8_ = &PTR__TableFunction_02435168;
  if (local_10b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10b0._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_1258);
  ParquetBloomProbeFunction::ParquetBloomProbeFunction(&local_b78);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_1410,(SimpleFunction *)&local_b78);
  local_1410._0_8_ = &PTR__SimpleNamedParameterFunction_0243ff38;
  local_16c0._0_8_ = &local_1380;
  local_1380 = (__buckets_ptr)0x0;
  local_1378 = local_b78.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters.
               _M_h._M_bucket_count;
  local_1370._M_nxt = (_Hash_node_base *)0x0;
  local_1368 = local_b78.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters.
               _M_h._M_element_count;
  local_1360._M_max_load_factor =
       local_b78.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_rehash_policy._M_max_load_factor;
  local_1360._4_4_ =
       local_b78.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_rehash_policy._4_4_;
  local_1360._M_next_resize =
       local_b78.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_rehash_policy._M_next_resize;
  local_1350 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_16c0._0_8_,
             &local_b78.super_TableFunction.super_SimpleNamedParameterFunction.named_parameters._M_h
             ,(_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
               *)local_16c0);
  local_1410._0_8_ = &PTR__TableFunction_02435168;
  switchD_012b9b0d::default(auStack_1348,&local_b78.super_TableFunction.bind,0xd6);
  local_1270 = local_b78.super_TableFunction.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1268._M_pi =
       local_b78.super_TableFunction.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_b78.super_TableFunction.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b78.super_TableFunction.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_b78.super_TableFunction.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b78.super_TableFunction.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_b78.super_TableFunction.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_1260 = local_b78.super_TableFunction.global_initialization;
  MultiFileReader::CreateFunctionSet(&local_1a08,(TableFunction *)local_1410);
  ExtensionUtil::RegisterFunction(pDVar5,&local_1a08);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&local_1a08.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a08.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p !=
      &local_1a08.super_FunctionSet<duckdb::TableFunction>.name.field_2) {
    operator_delete(local_1a08.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  local_1410._0_8_ = &PTR__TableFunction_02435168;
  if (local_1268._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1268._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_1410);
  psVar4 = &local_17d8.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.name.
            _M_string_length;
  local_17d8.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)psVar4;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_17d8,"parquet","");
  CopyFunction::CopyFunction((CopyFunction *)local_16c0,(string *)&local_17d8);
  if (local_17d8.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.
      _vptr_Function != (_func_int **)psVar4) {
    operator_delete(local_17d8.super_SimpleNamedParameterFunction.super_SimpleFunction.
                    super_Function._vptr_Function);
  }
  local_16c0._80_8_ = ParquetWriteSelect;
  local_16c0._88_8_ = ParquetWriteBind;
  local_16c0._104_8_ = ParquetWriteInitializeGlobal;
  local_16c0._96_8_ = ParquetWriteInitializeLocal;
  local_16c0._112_8_ = ParquetWriteGetWrittenStatistics;
  local_16c0._120_8_ = ParquetWriteSink;
  local_16c0._128_8_ = ParquetWriteCombine;
  local_16c0._136_8_ = ParquetWriteFinalize;
  local_16c0._144_8_ = ParquetWriteExecutionMode;
  local_16c0._208_8_ = MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileBindCopy;
  pvVar7 = vector<duckdb::TableFunction,_true>::operator[]
                     ((vector<duckdb::TableFunction,_true> *)&local_1bf0,0);
  ::std::__cxx11::string::_M_assign((string *)(local_16c0 + 0xe0));
  ::std::__cxx11::string::_M_assign(local_15c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (local_15a0,
             &(pvVar7->super_SimpleNamedParameterFunction).super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (local_1588,
             &(pvVar7->super_SimpleNamedParameterFunction).super_SimpleFunction.original_arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  if ((reference)(local_16c0 + 0xd8) != pvVar7) {
    local_1570 = (pvVar7->super_SimpleNamedParameterFunction).super_SimpleFunction.varargs.id_;
    local_156f = (pvVar7->super_SimpleNamedParameterFunction).super_SimpleFunction.varargs.
                 physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&local_1568,
               &(pvVar7->super_SimpleNamedParameterFunction).super_SimpleFunction.varargs.type_info_
              );
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              (local_1558,&(pvVar7->super_SimpleNamedParameterFunction).named_parameters._M_h);
  }
  switchD_012b9b0d::default(auStack_1520,&pvVar7->bind,0xd6);
  shared_ptr<duckdb::TableFunctionInfo,_true>::operator=(&local_1448,&pvVar7->function_info);
  local_1438 = pvVar7->global_initialization;
  local_16c0._152_8_ = ParquetWritePrepareBatch;
  local_16c0._160_8_ = ParquetWriteFlushBatch;
  local_16c0._168_8_ = ParquetWriteDesiredBatchSize;
  local_16c0._176_8_ = ParquetWriteRotateFiles;
  local_16c0._184_8_ = ParquetWriteRotateNextFile;
  local_16c0._192_8_ = ParquetCopySerialize;
  local_16c0._200_8_ = ParquetCopyDeserialize;
  ::std::__cxx11::string::_M_replace((ulong)&local_1430,0,local_1428,0x1d8c942);
  CopyFunction::CopyFunction(&local_2e0,(CopyFunction *)local_16c0);
  ExtensionUtil::RegisterFunction(pDVar5,&local_2e0);
  local_2e0.super_Function._vptr_Function = (_func_int **)&PTR__CopyFunction_02436598;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0.extension._M_dataplus._M_p != &local_2e0.extension.field_2) {
    operator_delete(local_2e0.extension._M_dataplus._M_p);
  }
  local_2e0.copy_from_function.super_SimpleNamedParameterFunction.super_SimpleFunction.
  super_Function._vptr_Function = (_func_int **)&PTR__TableFunction_02435168;
  if (local_2e0.copy_from_function.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2e0.copy_from_function.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_2e0.copy_from_function.super_SimpleNamedParameterFunction);
  Function::~Function(&local_2e0.super_Function);
  local_1c90._M_dataplus._M_p = (pointer)&local_1c90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c90,"add_parquet_key","");
  LogicalType::LogicalType((LogicalType *)local_1c60,VARCHAR);
  LogicalType::LogicalType((LogicalType *)(local_1c60 + 0x18),VARCHAR);
  __l._M_len = 2;
  __l._M_array = (iterator)local_1c60;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1b30,__l,
             &local_1c69);
  LogicalType::LogicalType(&local_1b48,INVALID);
  local_1c20 = (__hashtable_alloc *)&PTR__CopyFunction_02436598;
  PragmaFunction::PragmaCall(&local_17d8,&local_1c90,ParquetCrypto::AddKey,&local_1b30,&local_1b48);
  LogicalType::~LogicalType(&local_1b48);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1b30);
  lVar8 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_1c60 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c90._M_dataplus._M_p != &local_1c90.field_2) {
    operator_delete(local_1c90._M_dataplus._M_p);
  }
  SimpleFunction::SimpleFunction((SimpleFunction *)local_18f0,(SimpleFunction *)&local_17d8);
  local_18f0._0_8_ = &PTR__SimpleNamedParameterFunction_0243ff38;
  local_1c60._0_8_ = &local_1860;
  local_1860 = (__buckets_ptr)0x0;
  local_1858 = local_17d8.super_SimpleNamedParameterFunction.named_parameters._M_h._M_bucket_count;
  local_1850._M_nxt = (_Hash_node_base *)0x0;
  local_1848 = local_17d8.super_SimpleNamedParameterFunction.named_parameters._M_h._M_element_count;
  local_1840._M_max_load_factor =
       local_17d8.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_1840._4_4_ =
       local_17d8.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy._4_4_;
  local_1840._M_next_resize =
       local_17d8.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_next_resize;
  local_1830 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_1c60._0_8_,
             &local_17d8.super_SimpleNamedParameterFunction.named_parameters._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)local_1c60);
  local_18f0._0_8_ = &PTR__PragmaFunction_02442970;
  local_1828 = local_17d8.type;
  uStack_1827 = local_17d8._201_7_;
  p_Stack_1820 = local_17d8.query;
  local_1818 = local_17d8.function;
  local_1810._M_buckets = (__buckets_ptr)0x0;
  local_1810._M_bucket_count = local_17d8.named_parameters._M_h._M_bucket_count;
  local_1810._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1810._M_element_count = local_17d8.named_parameters._M_h._M_element_count;
  local_1810._M_rehash_policy._M_max_load_factor =
       local_17d8.named_parameters._M_h._M_rehash_policy._M_max_load_factor;
  local_1810._M_rehash_policy._4_4_ = local_17d8.named_parameters._M_h._M_rehash_policy._4_4_;
  local_1810._M_rehash_policy._M_next_resize =
       local_17d8.named_parameters._M_h._M_rehash_policy._M_next_resize;
  local_1810._M_single_bucket = (__node_base_ptr)0x0;
  local_1c60._0_8_ = &local_1810;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_1810,&local_17d8.named_parameters._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)local_1c60);
  ExtensionUtil::RegisterFunction(pDVar5,(PragmaFunction *)local_18f0);
  local_18f0._0_8_ = &PTR__PragmaFunction_02442970;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1810);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_18f0);
  pDVar5 = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&local_1c18->instance);
  this_00 = DBConfig::GetConfig(pDVar5);
  __position._M_current =
       (this_00->replacement_scans).
       super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
       super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->replacement_scans).
      super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
      super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<duckdb::ReplacementScan,std::allocator<duckdb::ReplacementScan>>::
    _M_realloc_insert<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>(&)(duckdb::ClientContext&,duckdb::ReplacementScanInput&,duckdb::optional_ptr<duckdb::ReplacementScanData,true>)>
              ((vector<duckdb::ReplacementScan,std::allocator<duckdb::ReplacementScan>> *)
               &this_00->replacement_scans,__position,ParquetScanReplacement);
  }
  else {
    (__position._M_current)->function = ParquetScanReplacement;
    ((__position._M_current)->data).
    super_unique_ptr<duckdb::ReplacementScanData,_std::default_delete<duckdb::ReplacementScanData>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::ReplacementScanData,_std::default_delete<duckdb::ReplacementScanData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ReplacementScanData_*,_std::default_delete<duckdb::ReplacementScanData>_>
    .super__Head_base<0UL,_duckdb::ReplacementScanData_*,_false>._M_head_impl =
         (ReplacementScanData *)0x0;
    ppRVar1 = &(this_00->replacement_scans).
               super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
               super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppRVar1 = *ppRVar1 + 1;
  }
  local_1c90._M_dataplus._M_p = (pointer)&local_1c90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c90,"binary_as_string","");
  local_1a98._M_dataplus._M_p = (pointer)&local_1a98.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a98,"In Parquet files, interpret binary data as a string.","");
  LogicalType::LogicalType(&local_1b60,BOOLEAN);
  LogicalType::LogicalType(&local_1b78,SQLNULL);
  Value::Value((Value *)local_1c60,&local_1b78);
  DBConfig::AddExtensionOption
            (this_00,&local_1c90,&local_1a98,&local_1b60,(Value *)local_1c60,
             (set_option_callback_t)0x0);
  Value::~Value((Value *)local_1c60);
  LogicalType::~LogicalType(&local_1b78);
  LogicalType::~LogicalType(&local_1b60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a98._M_dataplus._M_p != &local_1a98.field_2) {
    operator_delete(local_1a98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c90._M_dataplus._M_p != &local_1c90.field_2) {
    operator_delete(local_1c90._M_dataplus._M_p);
  }
  local_1c90._M_dataplus._M_p = (pointer)&local_1c90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c90,"disable_parquet_prefetching","");
  local_1ab8._M_dataplus._M_p = (pointer)&local_1ab8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1ab8,"Disable the prefetching mechanism in Parquet","");
  LogicalType::LogicalType(&local_1b90,BOOLEAN);
  Value::Value((Value *)local_1c60,false);
  DBConfig::AddExtensionOption
            (this_00,&local_1c90,&local_1ab8,&local_1b90,(Value *)local_1c60,
             (set_option_callback_t)0x0);
  Value::~Value((Value *)local_1c60);
  LogicalType::~LogicalType(&local_1b90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ab8._M_dataplus._M_p != &local_1ab8.field_2) {
    operator_delete(local_1ab8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c90._M_dataplus._M_p != &local_1c90.field_2) {
    operator_delete(local_1c90._M_dataplus._M_p);
  }
  local_1c90._M_dataplus._M_p = (pointer)&local_1c90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c90,"prefetch_all_parquet_files","");
  local_1ad8._M_dataplus._M_p = (pointer)&local_1ad8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1ad8,"Use the prefetching mechanism for all types of parquet files",""
            );
  LogicalType::LogicalType(&local_1ba8,BOOLEAN);
  Value::Value((Value *)local_1c60,false);
  DBConfig::AddExtensionOption
            (this_00,&local_1c90,&local_1ad8,&local_1ba8,(Value *)local_1c60,
             (set_option_callback_t)0x0);
  Value::~Value((Value *)local_1c60);
  LogicalType::~LogicalType(&local_1ba8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad8._M_dataplus._M_p != &local_1ad8.field_2) {
    operator_delete(local_1ad8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c90._M_dataplus._M_p != &local_1c90.field_2) {
    operator_delete(local_1c90._M_dataplus._M_p);
  }
  local_1c90._M_dataplus._M_p = (pointer)&local_1c90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c90,"parquet_metadata_cache","");
  local_1af8._M_dataplus._M_p = (pointer)&local_1af8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1af8,
             "Cache Parquet metadata - useful when reading the same files multiple times","");
  LogicalType::LogicalType(&local_1bc0,BOOLEAN);
  Value::Value((Value *)local_1c60,false);
  DBConfig::AddExtensionOption
            (this_00,&local_1c90,&local_1af8,&local_1bc0,(Value *)local_1c60,
             (set_option_callback_t)0x0);
  Value::~Value((Value *)local_1c60);
  LogicalType::~LogicalType(&local_1bc0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af8._M_dataplus._M_p != &local_1af8.field_2) {
    operator_delete(local_1af8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c90._M_dataplus._M_p != &local_1c90.field_2) {
    operator_delete(local_1c90._M_dataplus._M_p);
  }
  local_1c90._M_dataplus._M_p = (pointer)&local_1c90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c90,"enable_geoparquet_conversion","");
  local_1b18._M_dataplus._M_p = (pointer)&local_1b18.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b18,
             "Attempt to decode/encode geometry data in/as GeoParquet files if the spatial extension is present."
             ,"");
  LogicalType::LogicalType(&local_1bd8,BOOLEAN);
  Value::BOOLEAN((Value *)local_1c60,true);
  DBConfig::AddExtensionOption
            (this_00,&local_1c90,&local_1b18,&local_1bd8,(Value *)local_1c60,
             (set_option_callback_t)0x0);
  Value::~Value((Value *)local_1c60);
  LogicalType::~LogicalType(&local_1bd8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b18._M_dataplus._M_p != &local_1b18.field_2) {
    operator_delete(local_1b18._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c90._M_dataplus._M_p != &local_1c90.field_2) {
    operator_delete(local_1c90._M_dataplus._M_p);
  }
  local_17d8.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02442970;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_17d8.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_17d8.super_SimpleNamedParameterFunction);
  local_16c0._0_8_ = local_1c20;
  if (local_1430._M_p != local_1420) {
    operator_delete(local_1430._M_p);
  }
  local_16c0._216_8_ = &PTR__TableFunction_02435168;
  if (local_1448.internal.super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1448.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)(local_16c0 + 0xd8));
  Function::~Function((Function *)local_16c0);
  local_b78.super_TableFunction.super_SimpleNamedParameterFunction.super_SimpleFunction.
  super_Function._vptr_Function = (_func_int **)&PTR__TableFunction_02435168;
  if (local_b78.super_TableFunction.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b78.super_TableFunction.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)&local_b78);
  local_9c0.super_TableFunction.super_SimpleNamedParameterFunction.super_SimpleFunction.
  super_Function._vptr_Function = (_func_int **)&PTR__TableFunction_02435168;
  if (local_9c0.super_TableFunction.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_9c0.super_TableFunction.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)&local_9c0);
  local_808.super_TableFunction.super_SimpleNamedParameterFunction.super_SimpleFunction.
  super_Function._vptr_Function = (_func_int **)&PTR__TableFunction_02435168;
  if (local_808.super_TableFunction.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_808.super_TableFunction.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)&local_808);
  local_650.super_TableFunction.super_SimpleNamedParameterFunction.super_SimpleFunction.
  super_Function._vptr_Function = (_func_int **)&PTR__TableFunction_02435168;
  if (local_650.super_TableFunction.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_650.super_TableFunction.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)&local_650);
  local_498.super_TableFunction.super_SimpleNamedParameterFunction.super_SimpleFunction.
  super_Function._vptr_Function = (_func_int **)&PTR__TableFunction_02435168;
  if (local_498.super_TableFunction.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_498.super_TableFunction.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)&local_498);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector(&local_1bf0)
  ;
  if (local_1c10 != local_1c00) {
    operator_delete(local_1c10);
  }
  return;
}

Assistant:

void ParquetExtension::Load(DuckDB &db) {
	auto &db_instance = *db.instance;
	auto &fs = db.GetFileSystem();
	fs.RegisterSubSystem(FileCompressionType::ZSTD, make_uniq<ZStdFileSystem>());

	auto scan_fun = ParquetScanFunction::GetFunctionSet();
	scan_fun.name = "read_parquet";
	ExtensionUtil::RegisterFunction(db_instance, scan_fun);
	scan_fun.name = "parquet_scan";
	ExtensionUtil::RegisterFunction(db_instance, scan_fun);

	// parquet_metadata
	ParquetMetaDataFunction meta_fun;
	ExtensionUtil::RegisterFunction(db_instance, MultiFileReader::CreateFunctionSet(meta_fun));

	// parquet_schema
	ParquetSchemaFunction schema_fun;
	ExtensionUtil::RegisterFunction(db_instance, MultiFileReader::CreateFunctionSet(schema_fun));

	// parquet_key_value_metadata
	ParquetKeyValueMetadataFunction kv_meta_fun;
	ExtensionUtil::RegisterFunction(db_instance, MultiFileReader::CreateFunctionSet(kv_meta_fun));

	// parquet_file_metadata
	ParquetFileMetadataFunction file_meta_fun;
	ExtensionUtil::RegisterFunction(db_instance, MultiFileReader::CreateFunctionSet(file_meta_fun));

	// parquet_bloom_probe
	ParquetBloomProbeFunction bloom_probe_fun;
	ExtensionUtil::RegisterFunction(db_instance, MultiFileReader::CreateFunctionSet(bloom_probe_fun));

	CopyFunction function("parquet");
	function.copy_to_select = ParquetWriteSelect;
	function.copy_to_bind = ParquetWriteBind;
	function.copy_to_initialize_global = ParquetWriteInitializeGlobal;
	function.copy_to_initialize_local = ParquetWriteInitializeLocal;
	function.copy_to_get_written_statistics = ParquetWriteGetWrittenStatistics;
	function.copy_to_sink = ParquetWriteSink;
	function.copy_to_combine = ParquetWriteCombine;
	function.copy_to_finalize = ParquetWriteFinalize;
	function.execution_mode = ParquetWriteExecutionMode;
	function.copy_from_bind = MultiFileFunction<ParquetMultiFileInfo>::MultiFileBindCopy;
	function.copy_from_function = scan_fun.functions[0];
	function.prepare_batch = ParquetWritePrepareBatch;
	function.flush_batch = ParquetWriteFlushBatch;
	function.desired_batch_size = ParquetWriteDesiredBatchSize;
	function.rotate_files = ParquetWriteRotateFiles;
	function.rotate_next_file = ParquetWriteRotateNextFile;
	function.serialize = ParquetCopySerialize;
	function.deserialize = ParquetCopyDeserialize;

	function.extension = "parquet";
	ExtensionUtil::RegisterFunction(db_instance, function);

	// parquet_key
	auto parquet_key_fun = PragmaFunction::PragmaCall("add_parquet_key", ParquetCrypto::AddKey,
	                                                  {LogicalType::VARCHAR, LogicalType::VARCHAR});
	ExtensionUtil::RegisterFunction(db_instance, parquet_key_fun);

	auto &config = DBConfig::GetConfig(*db.instance);
	config.replacement_scans.emplace_back(ParquetScanReplacement);
	config.AddExtensionOption("binary_as_string", "In Parquet files, interpret binary data as a string.",
	                          LogicalType::BOOLEAN);
	config.AddExtensionOption("disable_parquet_prefetching", "Disable the prefetching mechanism in Parquet",
	                          LogicalType::BOOLEAN, Value(false));
	config.AddExtensionOption("prefetch_all_parquet_files",
	                          "Use the prefetching mechanism for all types of parquet files", LogicalType::BOOLEAN,
	                          Value(false));
	config.AddExtensionOption("parquet_metadata_cache",
	                          "Cache Parquet metadata - useful when reading the same files multiple times",
	                          LogicalType::BOOLEAN, Value(false));
	config.AddExtensionOption(
	    "enable_geoparquet_conversion",
	    "Attempt to decode/encode geometry data in/as GeoParquet files if the spatial extension is present.",
	    LogicalType::BOOLEAN, Value::BOOLEAN(true));
}